

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

bool __thiscall
tinyusdz::Animatable<std::array<float,_4UL>_>::get_scalar
          (Animatable<std::array<float,_4UL>_> *this,array<float,_4UL> *v)

{
  bool bVar1;
  array<float,_4UL> *v_local;
  Animatable<std::array<float,_4UL>_> *this_local;
  
  if (v == (array<float,_4UL> *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    bVar1 = is_blocked(this);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      bVar1 = has_value(this);
      if (bVar1) {
        *(undefined8 *)v->_M_elems = *(undefined8 *)(this->_value)._M_elems;
        *(undefined8 *)(v->_M_elems + 2) = *(undefined8 *)((this->_value)._M_elems + 2);
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool get_scalar(T *v) const {
    if (!v) {
      return false;
    }

    if (is_blocked()) {
      return false;
    } else if (has_value()) {
      (*v) = _value;
      return true;
    }

    // timesamples
    return false;
  }